

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

bool __thiscall llvm::Triple::isCompatibleWith(Triple *this,Triple *Other)

{
  ArchType AVar1;
  VendorType VVar2;
  SubArchType SVar3;
  SubArchType SVar4;
  VendorType VVar5;
  OSType OVar6;
  OSType OVar7;
  EnvironmentType EVar8;
  EnvironmentType EVar9;
  ObjectFormatType OVar10;
  ObjectFormatType OVar11;
  ArchType AVar12;
  undefined1 local_51;
  undefined1 local_39;
  undefined1 local_29;
  Triple *Other_local;
  Triple *this_local;
  
  AVar1 = getArch(this);
  if (AVar1 == thumb) {
    AVar1 = getArch(Other);
    if (AVar1 != arm) goto LAB_002d08f0;
LAB_002d094c:
    VVar2 = getVendor(this);
    if (VVar2 == Apple) {
      SVar3 = getSubArch(this);
      SVar4 = getSubArch(Other);
      local_29 = false;
      if (SVar3 == SVar4) {
        VVar2 = getVendor(this);
        VVar5 = getVendor(Other);
        local_29 = false;
        if (VVar2 == VVar5) {
          OVar6 = getOS(this);
          OVar7 = getOS(Other);
          local_29 = OVar6 == OVar7;
        }
      }
      this_local._7_1_ = local_29;
    }
    else {
      SVar3 = getSubArch(this);
      SVar4 = getSubArch(Other);
      local_39 = false;
      if (SVar3 == SVar4) {
        VVar2 = getVendor(this);
        VVar5 = getVendor(Other);
        local_39 = false;
        if (VVar2 == VVar5) {
          OVar6 = getOS(this);
          OVar7 = getOS(Other);
          local_39 = false;
          if (OVar6 == OVar7) {
            EVar8 = getEnvironment(this);
            EVar9 = getEnvironment(Other);
            local_39 = false;
            if (EVar8 == EVar9) {
              OVar10 = getObjectFormat(this);
              OVar11 = getObjectFormat(Other);
              local_39 = OVar10 == OVar11;
            }
          }
        }
      }
      this_local._7_1_ = local_39;
    }
  }
  else {
LAB_002d08f0:
    AVar1 = getArch(this);
    if (AVar1 == arm) {
      AVar1 = getArch(Other);
      if (AVar1 == thumb) goto LAB_002d094c;
    }
    AVar1 = getArch(this);
    if (AVar1 == thumbeb) {
      AVar1 = getArch(Other);
      if (AVar1 == armeb) goto LAB_002d094c;
    }
    AVar1 = getArch(this);
    if (AVar1 == armeb) {
      AVar1 = getArch(Other);
      if (AVar1 == thumbeb) goto LAB_002d094c;
    }
    VVar2 = getVendor(this);
    if (VVar2 == Apple) {
      AVar1 = getArch(this);
      AVar12 = getArch(Other);
      local_51 = false;
      if (AVar1 == AVar12) {
        SVar3 = getSubArch(this);
        SVar4 = getSubArch(Other);
        local_51 = false;
        if (SVar3 == SVar4) {
          VVar2 = getVendor(this);
          VVar5 = getVendor(Other);
          local_51 = false;
          if (VVar2 == VVar5) {
            OVar6 = getOS(this);
            OVar7 = getOS(Other);
            local_51 = OVar6 == OVar7;
          }
        }
      }
      this_local._7_1_ = local_51;
    }
    else {
      this_local._7_1_ = operator==(this,Other);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Triple::isCompatibleWith(const Triple &Other) const {
  // ARM and Thumb triples are compatible, if subarch, vendor and OS match.
  if ((getArch() == Triple::thumb && Other.getArch() == Triple::arm) ||
      (getArch() == Triple::arm && Other.getArch() == Triple::thumb) ||
      (getArch() == Triple::thumbeb && Other.getArch() == Triple::armeb) ||
      (getArch() == Triple::armeb && Other.getArch() == Triple::thumbeb)) {
    if (getVendor() == Triple::Apple)
      return getSubArch() == Other.getSubArch() &&
             getVendor() == Other.getVendor() && getOS() == Other.getOS();
    else
      return getSubArch() == Other.getSubArch() &&
             getVendor() == Other.getVendor() && getOS() == Other.getOS() &&
             getEnvironment() == Other.getEnvironment() &&
             getObjectFormat() == Other.getObjectFormat();
  }

  // If vendor is apple, ignore the version number.
  if (getVendor() == Triple::Apple)
    return getArch() == Other.getArch() && getSubArch() == Other.getSubArch() &&
           getVendor() == Other.getVendor() && getOS() == Other.getOS();

  return *this == Other;
}